

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5BufferCompare(Fts5Buffer *pLeft,Fts5Buffer *pRight)

{
  int local_2c;
  int local_28;
  int local_24;
  int res;
  int nCmp;
  Fts5Buffer *pRight_local;
  Fts5Buffer *pLeft_local;
  
  if (pLeft->n < pRight->n) {
    local_24 = pLeft->n;
  }
  else {
    local_24 = pRight->n;
  }
  if (local_24 == 0) {
    local_28 = 0;
  }
  else {
    local_28 = memcmp(pLeft->p,pRight->p,(long)local_24);
  }
  if (local_28 == 0) {
    local_2c = pLeft->n - pRight->n;
  }
  else {
    local_2c = local_28;
  }
  return local_2c;
}

Assistant:

static int fts5BufferCompare(Fts5Buffer *pLeft, Fts5Buffer *pRight){
  int nCmp = MIN(pLeft->n, pRight->n);
  int res = fts5Memcmp(pLeft->p, pRight->p, nCmp);
  return (res==0 ? (pLeft->n - pRight->n) : res);
}